

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O2

void linedebug_hunks(GlobalVars *gv,FILE *f,LinkedSection *ls)

{
  _IO_FILE *p_Var1;
  _IO_codecvt *p_Var2;
  long lVar3;
  long lVar4;
  int iVar5;
  _IO_FILE *p_Var6;
  long lVar7;
  
  p_Var1 = f->_chain;
  while (p_Var6 = p_Var1, p_Var1 = *(_IO_FILE **)p_Var6, p_Var1 != (_IO_FILE *)0x0) {
    for (p_Var2 = p_Var6->_codecvt; p_Var2 != (_IO_codecvt *)0x0; p_Var2 = *(_IO_codecvt **)p_Var2)
    {
      if ((p_Var2[8] == (_IO_codecvt)0x1) && (p_Var2[9] == (_IO_codecvt)0x1)) {
        fwrite32be((FILE *)gv,0x3f1);
        iVar5 = strlen32(*(char **)(p_Var2 + 0x10));
        fwrite32be((FILE *)gv,iVar5 + *(int *)(p_Var2 + 0x18) * 2 + 3);
        fwrite32be((FILE *)gv,*(uint32_t *)&p_Var6->_IO_buf_end);
        fwrite32be((FILE *)gv,0x4c494e45);
        hunk_name_len((FILE *)gv,*(char **)(p_Var2 + 0x10));
        lVar3 = *(long *)(p_Var2 + 0x20);
        lVar4 = *(long *)(p_Var2 + 0x28);
        for (lVar7 = 0; (uint)lVar7 < *(uint *)(p_Var2 + 0x18); lVar7 = lVar7 + 1) {
          fwrite32be((FILE *)gv,*(uint32_t *)(lVar3 + lVar7 * 4));
          fwrite32be((FILE *)gv,*(uint32_t *)(lVar4 + lVar7 * 4));
        }
      }
    }
  }
  return;
}

Assistant:

static void linedebug_hunks(struct GlobalVars *gv,FILE *f,
                            struct LinkedSection *ls)
{
  struct Section *sec = (struct Section *)ls->sections.first;
  struct Section *nextsec;
  struct LineDebug *ldb;

  while (nextsec = (struct Section *)sec->n.next) {
    if (ldb = (struct LineDebug *)sec->special) {
      do {
        if (ldb->tgext.id==TGEXT_AMIGAOS && ldb->tgext.sub_id==SUBID_LINE) {
          uint32_t i,*lptr,*optr;

          fwrite32be(f,HUNK_DEBUG);
          fwrite32be(f,3 + strlen32(ldb->source_name) +
                     (ldb->num_entries<<1));
          fwrite32be(f,(uint32_t)sec->offset);
          fwrite32be(f,0x4c494e45);  /* "LINE" */
          hunk_name_len(f,ldb->source_name);
          for (i=0,lptr=ldb->lines,optr=ldb->offsets;
               i<ldb->num_entries; i++) {
            fwrite32be(f,*lptr++);
            fwrite32be(f,*optr++);
          }
        }
      }
      while (ldb = (struct LineDebug *)ldb->tgext.next);
    }
    sec = nextsec;
  }
}